

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::RenderPassCreateInfo::RenderPassCreateInfo
          (RenderPassCreateInfo *this,deUint32 _attachmentCount,
          VkAttachmentDescription *_pAttachments,deUint32 _subpassCount,
          VkSubpassDescription *_pSubpasses,deUint32 _dependencyCount,
          VkSubpassDependency *_pDependiences)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer pVVar5;
  pointer pVVar6;
  pointer pVVar7;
  pointer pSVar8;
  pointer pVVar9;
  pointer pVVar10;
  pointer pVVar11;
  deUint32 dVar12;
  vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_> local_78;
  allocator_type local_59;
  vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_> local_58;
  vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
  *local_38;
  
  local_38 = &this->m_attachments;
  memset(local_38,0,0x90);
  std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>::
  vector<vk::VkAttachmentDescription_const*,void>
            ((vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>
              *)&local_78,_pAttachments,_pAttachments + _attachmentCount,(allocator_type *)&local_58
            );
  pAVar1 = (this->m_attachments).
           super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = (this->m_attachments).
           super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_attachments).
  super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->m_attachments).
  super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_attachments).
  super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pAVar1 != (pointer)0x0) {
    operator_delete(pAVar1,(long)pAVar2 - (long)pAVar1);
    if (local_78.
        super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>::
  vector<vk::VkSubpassDescription_const*,void>
            ((vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>> *)
             &local_58,_pSubpasses,_pSubpasses + _subpassCount,&local_59);
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_subpasses).
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_subpasses).
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_subpasses).
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_subpasses).
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_subpasses).
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_subpasses).
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
  ~vector(&local_78);
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
  ~vector(&local_58);
  std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>::
  vector<vk::VkSubpassDependency_const*,void>
            ((vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>> *)
             &local_78,_pDependiences,_pDependiences + _dependencyCount,(allocator_type *)&local_58)
  ;
  pSVar3 = (this->m_dependiences).
           super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar4 = (this->m_dependiences).
           super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_dependiences).
  super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->m_dependiences).
  super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_dependiences).
  super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)pSVar4 - (long)pSVar3);
    if (local_78.
        super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &local_78,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_58);
  pVVar11 = (this->m_attachmentsStructs).
            super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (this->m_attachmentsStructs).
           super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_attachmentsStructs).
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->m_attachmentsStructs).
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_attachmentsStructs).
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pVVar11 != (pointer)0x0) {
    operator_delete(pVVar11,(long)pVVar5 - (long)pVVar11);
    if (local_78.
        super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDescription*,std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>>,void>
            ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)&local_78,
             (this->m_subpasses).
             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_subpasses).
             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_58);
  pVVar10 = (this->m_subpassesStructs).
            super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (this->m_subpassesStructs).
           super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_subpassesStructs).
  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_78.
         super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
         ._M_impl.super__Vector_impl_data._M_start)->super_VkSubpassDescription;
  (this->m_subpassesStructs).
  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_78.
         super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
         ._M_impl.super__Vector_impl_data._M_finish)->super_VkSubpassDescription;
  (this->m_subpassesStructs).
  super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_78.
         super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_VkSubpassDescription;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pVVar10 != (pointer)0x0) {
    operator_delete(pVVar10,(long)pVVar6 - (long)pVVar10);
    if (local_78.
        super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_78,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_58);
  pVVar9 = (this->m_dependiencesStructs).
           super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar7 = (this->m_dependiencesStructs).
           super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_dependiencesStructs).
  super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_start;
  (this->m_dependiencesStructs).
  super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_dependiencesStructs).
  super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_78.
                super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pVVar9 != (pointer)0x0) {
    operator_delete(pVVar9,(long)pVVar7 - (long)pVVar9);
    if (local_78.
        super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  (this->super_VkRenderPassCreateInfo).sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  pVVar9 = (pointer)0x0;
  (this->super_VkRenderPassCreateInfo).pNext = (void *)0x0;
  (this->super_VkRenderPassCreateInfo).flags = 0;
  pSVar8 = (this->m_subpasses).
           super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar12 = (int)((ulong)((long)(this->m_attachments).
                               super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_attachments).
                              super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39;
  (this->super_VkRenderPassCreateInfo).attachmentCount = dVar12;
  pVVar11 = (pointer)0x0;
  if (dVar12 != 0) {
    pVVar11 = (this->m_attachmentsStructs).
              super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pAttachments = pVVar11;
  dVar12 = (int)((ulong)((long)pSVar8 -
                        (long)(this->m_subpasses).
                              super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x45d1745d;
  (this->super_VkRenderPassCreateInfo).subpassCount = dVar12;
  pVVar10 = (pointer)0x0;
  if (dVar12 != 0) {
    pVVar10 = (this->m_subpassesStructs).
              super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pSubpasses = pVVar10;
  dVar12 = (int)((ulong)((long)(this->m_dependiences).
                               super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_dependiences).
                              super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x49249249;
  (this->super_VkRenderPassCreateInfo).dependencyCount = dVar12;
  if (dVar12 != 0) {
    pVVar9 = (this->m_dependiencesStructs).
             super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pDependencies = pVVar9;
  return;
}

Assistant:

RenderPassCreateInfo::RenderPassCreateInfo (deUint32							_attachmentCount,
											const vk::VkAttachmentDescription*	_pAttachments,
											deUint32							_subpassCount,
											const vk::VkSubpassDescription*		_pSubpasses,
											deUint32							_dependencyCount,
											const vk::VkSubpassDependency*		_pDependiences)
{

	m_attachments	= std::vector<AttachmentDescription>(_pAttachments, _pAttachments + _attachmentCount);
	m_subpasses		= std::vector<SubpassDescription>(_pSubpasses, _pSubpasses + _subpassCount);
	m_dependiences	= std::vector<SubpassDependency>(_pDependiences, _pDependiences + _dependencyCount);

	m_attachmentsStructs	= std::vector<vk::VkAttachmentDescription>	(m_attachments.begin(),		m_attachments.end());
	m_subpassesStructs		= std::vector<vk::VkSubpassDescription>		(m_subpasses.begin(),		m_subpasses.end());
	m_dependiencesStructs	= std::vector<vk::VkSubpassDependency>		(m_dependiences.begin(),	m_dependiences.end());

	sType = vk::VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	pNext = DE_NULL;
	flags = 0;

	attachmentCount = static_cast<deUint32>(m_attachments.size());

	if (attachmentCount) {
		pAttachments = &m_attachmentsStructs[0];
	}
	else
	{
		pAttachments = DE_NULL;
	}

	subpassCount = static_cast<deUint32>(m_subpasses.size());

	if (subpassCount) {
		pSubpasses = &m_subpassesStructs[0];
	}
	else
	{
		pSubpasses = DE_NULL;
	}

	dependencyCount = static_cast<deUint32>(m_dependiences.size());

	if (dependencyCount) {
		pDependencies = &m_dependiencesStructs[0];
	}
	else
	{
		pDependencies = DE_NULL;
	}
}